

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O3

int Curl_pgrsUpdate(Curl_easy *data)

{
  FILE *whereto;
  _Bool _Var1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  curl_off_t seconds;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  curltime now;
  long local_a8;
  long local_a0;
  char local_96 [10];
  char time_total [10];
  char time_left [10];
  char max5 [6] [10];
  
  now = Curl_now();
  _Var1 = progress_calc(data,now);
  if (((data->progress).flags & 0x10) != 0) {
    return 0;
  }
  if ((data->set).fxferinfo == (curl_xferinfo_callback)0x0) {
    if ((data->set).fprogress != (curl_progress_callback)0x0) {
      Curl_set_in_callback(data,true);
      iVar2 = (*(data->set).fprogress)
                        ((data->set).progress_client,(double)(data->progress).dl.total_size,
                         (double)(data->progress).dl.cur_size,(double)(data->progress).ul.total_size
                         ,(double)(data->progress).ul.cur_size);
      goto LAB_0014d743;
    }
    if (!_Var1) {
      return 0;
    }
  }
  else {
    Curl_set_in_callback(data,true);
    iVar2 = (*(data->set).fxferinfo)
                      ((data->set).progress_client,(data->progress).dl.total_size,
                       (data->progress).dl.cur_size,(data->progress).ul.total_size,
                       (data->progress).ul.cur_size);
LAB_0014d743:
    Curl_set_in_callback(data,false);
    if ((iVar2 != 0) && (iVar2 != 0x10000001)) {
      Curl_failf(data,"Callback aborted");
    }
    iVar8 = 0;
    if (iVar2 != 0x10000001) {
      iVar8 = iVar2;
    }
    if (iVar2 != 0x10000001 || !_Var1) {
      return iVar8;
    }
  }
  lVar5 = (data->progress).timespent;
  uVar7 = (data->progress).flags;
  if (-1 < (char)uVar7) {
    if ((data->state).resume_from != 0) {
      curl_mfprintf((data->set).err,"** Resuming transfer from byte position %ld\n");
    }
    curl_mfprintf((data->set).err,
                  "  %% Total    %% Received %% Xferd  Average Speed   Time    Time     Time  Current\n                                 Dload  Upload   Total   Spent    Left  Speed\n"
                 );
    uVar7 = (data->progress).flags | 0x80;
    (data->progress).flags = uVar7;
  }
  lVar5 = lVar5 / 1000000;
  if (((uVar7 & 0x20) == 0) || (lVar3 = (data->progress).ul.speed, lVar3 < 1)) {
    lVar3 = 0;
LAB_0014d854:
    local_a0 = 0;
  }
  else {
    uVar6 = (data->progress).ul.total_size;
    local_a0 = (data->progress).ul.cur_size;
    lVar3 = (long)uVar6 / lVar3;
    if ((long)uVar6 < 0x2711) {
      if ((long)uVar6 < 1) goto LAB_0014d854;
      local_a0 = local_a0 * 100;
    }
    else {
      uVar6 = uVar6 / 100;
    }
    local_a0 = local_a0 / (long)uVar6;
  }
  if (((uVar7 & 0x40) == 0) || (lVar4 = (data->progress).dl.speed, lVar4 < 1)) {
    lVar4 = 0;
LAB_0014d8da:
    local_a8 = 0;
  }
  else {
    uVar6 = (data->progress).dl.total_size;
    local_a8 = (data->progress).dl.cur_size;
    lVar4 = (long)uVar6 / lVar4;
    if ((long)uVar6 < 0x2711) {
      if ((long)uVar6 < 1) goto LAB_0014d8da;
      local_a8 = local_a8 * 100;
    }
    else {
      uVar6 = uVar6 / 100;
    }
    local_a8 = local_a8 / (long)uVar6;
  }
  if (lVar4 < lVar3) {
    lVar4 = lVar3;
  }
  seconds = 0;
  if (0 < lVar4) {
    seconds = lVar4 - lVar5;
  }
  time2str(time_left,seconds);
  time2str(time_total,lVar4);
  time2str(local_96,lVar5);
  uVar7 = (data->progress).flags;
  lVar5 = (&(data->progress).ul.total_size)[(uVar7 & 0x20) == 0];
  lVar3 = (&(data->progress).dl.total_size)[(uVar7 & 0x40) == 0];
  uVar6 = lVar5 + lVar3;
  if (0x7fffffffffffffff - lVar5 < lVar3) {
    uVar6 = 0x7fffffffffffffff;
  }
  lVar5 = (data->progress).ul.cur_size + (data->progress).dl.cur_size;
  if ((long)uVar6 < 0x2711) {
    if ((long)uVar6 < 1) {
      lVar5 = 0;
    }
    else {
      lVar5 = (lVar5 * 100) / (long)uVar6;
    }
  }
  else {
    lVar5 = lVar5 / (long)(uVar6 / 100);
  }
  whereto = (data->set).err;
  max5data(uVar6,max5[2]);
  max5data((data->progress).dl.cur_size,max5[0]);
  max5data((data->progress).ul.cur_size,max5[1]);
  max5data((data->progress).dl.speed,max5[3]);
  max5data((data->progress).ul.speed,max5[4]);
  max5data((data->progress).current_speed,max5[5]);
  curl_mfprintf(whereto,"\r%3ld %s  %3ld %s  %3ld %s  %s  %s %s %s %s %s",lVar5,max5 + 2,local_a8,
                max5,local_a0,max5 + 1,max5 + 3,max5 + 4,time_total,local_96,time_left,max5 + 5);
  fflush((FILE *)(data->set).err);
  return 0;
}

Assistant:

int Curl_pgrsUpdate(struct Curl_easy *data)
{
  struct curltime now = Curl_now(); /* what time is it */
  bool showprogress = progress_calc(data, now);
  return pgrsupdate(data, showprogress);
}